

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O3

Result<wasm::Ok> * __thiscall
Shell::assertAction(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,AssertAction *assn)

{
  long *plVar1;
  ActionAssertionType AVar2;
  long lVar3;
  char *pcVar4;
  stringstream local_208 [8];
  stringstream err;
  ostream local_1f8 [112];
  ios_base local_188 [264];
  undefined1 local_80 [8];
  ActionResult result;
  long local_38;
  long local_30;
  undefined8 uStack_28;
  
  std::__cxx11::stringstream::stringstream(local_208);
  doAction((ActionResult *)local_80,this,&assn->action);
  AVar2 = assn->type;
  if (AVar2 == Trap) {
    if (result.
        super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
        .
        super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
        .
        super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
        .
        super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
        .
        super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
        .
        super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
        ._M_u._M_first._M_storage._M_storage[0x30] == '\x01') {
LAB_001441c8:
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      goto LAB_0014427d;
    }
    lVar3 = 0xd;
    pcVar4 = "expected trap";
LAB_001441dd:
    std::__ostream_insert<char,std::char_traits<char>>(local_1f8,pcVar4,lVar3);
  }
  else {
    if (AVar2 == Exhaustion) {
      if (result.
          super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
          .
          super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
          .
          super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
          .
          super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
          .
          super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
          .
          super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
          ._M_u._M_first._M_storage._M_storage[0x30] == '\x02') goto LAB_001441c8;
      lVar3 = 0x13;
      pcVar4 = "expected exhaustion";
      goto LAB_001441dd;
    }
    if (AVar2 == Exception) {
      if (result.
          super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
          .
          super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
          .
          super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
          .
          super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
          .
          super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
          .
          super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
          ._M_u._M_first._M_storage._M_storage[0x30] == '\x03') goto LAB_001441c8;
      lVar3 = 0x12;
      pcVar4 = "expected exception";
      goto LAB_001441dd;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1f8,", got ",6);
  resultToString_abi_cxx11_
            ((string *)
             ((long)&result.
                     super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
             + 0x38),this,(ActionResult *)local_80);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1f8,
             (char *)result.
                     super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     ._56_8_,local_38);
  if ((long *)result.
              super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              ._56_8_ != &stack0xffffffffffffffd0) {
    operator_delete((void *)result.
                            super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                            .
                            super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                            .
                            super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                            .
                            super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                            .
                            super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                            .
                            super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                            ._56_8_,local_30 + 1);
  }
  std::__cxx11::stringbuf::str();
  plVar1 = (long *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
  *(long **)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> = plVar1;
  if ((long *)result.
              super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              ._56_8_ == &stack0xffffffffffffffd0) {
    *plVar1 = local_30;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_28;
  }
  else {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
         result.
         super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         .
         super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         .
         super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         .
         super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         .
         super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         .
         super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         ._56_8_;
    *(long *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_30;
  }
  *(long *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_38;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
LAB_0014427d:
  std::__detail::__variant::
  _Variant_storage<false,_wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
  ::~_Variant_storage((_Variant_storage<false,_wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       *)local_80);
  std::__cxx11::stringstream::~stringstream(local_208);
  std::ios_base::~ios_base(local_188);
  return __return_storage_ptr__;
}

Assistant:

Result<> assertAction(AssertAction& assn) {
    std::stringstream err;
    auto result = doAction(assn.action);
    switch (assn.type) {
      case ActionAssertionType::Trap:
        if (std::get_if<TrapResult>(&result)) {
          return Ok{};
        }
        err << "expected trap";
        break;
      case ActionAssertionType::Exhaustion:
        if (std::get_if<HostLimitResult>(&result)) {
          return Ok{};
        }
        err << "expected exhaustion";
        break;
      case ActionAssertionType::Exception:
        if (std::get_if<ExceptionResult>(&result)) {
          return Ok{};
        }
        err << "expected exception";
        break;
    }
    err << ", got " << resultToString(result);
    return Err{err.str()};
  }